

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_api.c
# Opt level: O0

MPP_RET avs2d_callback(void *decoder,void *info)

{
  uint uVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  RK_U32 RVar4;
  bool bVar5;
  uint local_68;
  RK_U32 ref_used_flag;
  RK_U32 ref_used;
  RK_U32 discard;
  RK_U32 error;
  RK_U32 i;
  MppFrame ref_frm;
  MppFrame mframe;
  HalDecTask *task_dec;
  DecCbHalDone *ctx;
  Avs2dCtx_t *p_dec;
  void *pvStack_20;
  MPP_RET ret;
  void *info_local;
  void *decoder_local;
  
  p_dec._4_4_ = MPP_ERR_UNKNOW;
  mframe = *info;
  ref_frm = (MppFrame)0x0;
  _error = (MppFrame)0x0;
  ref_used = 0;
  ref_used_flag = 0;
  if ((*(ulong *)((long)mframe + 8) >> 7 & 1) == 0) {
    local_68 = 0xff;
  }
  else {
    local_68 = (uint)((ulong)*(undefined8 *)((long)mframe + 8) >> 0x20) & 0xffff;
  }
  task_dec = (HalDecTask *)info;
  ctx = (DecCbHalDone *)decoder;
  pvStack_20 = info;
  info_local = decoder;
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","In.","avs2d_callback");
  }
  mpp_buf_slot_get_prop(ctx->task,*(RK_S32 *)((long)mframe + 0x34),SLOT_FRAME_PTR,&ref_frm);
  if (ref_frm == (MppFrame)0x0) {
    p_dec._4_4_ = MPP_ERR_UNKNOW;
    if ((avs2d_parse_debug & 0x8000) != 0) {
      _mpp_log_l(4,"avs2d_api","[CALLBACK]: failed to get frame\n",(char *)0x0);
    }
  }
  else {
    if (((task_dec->syntax).number == 0) && ((*(ulong *)((long)mframe + 8) >> 3 & 1) == 0)) {
      if ((((uint)((ulong)*(undefined8 *)((long)mframe + 8) >> 8) & 0xffff & local_68) != 0) &&
         (ref_used_flag = 1, (avs2d_parse_debug & 0x8000) != 0)) {
        _mpp_log_l(4,"avs2d_api","[CALLBACK]: fake ref used, miss 0x%x used 0x%x\n",(char *)0x0,
                   *(ulong *)((long)mframe + 8) >> 8 & 0xffff,(ulong)local_68);
      }
    }
    else {
      bVar5 = (*(ulong *)((long)mframe + 8) >> 4 & 1) == 0;
      ref_used = (RK_U32)!bVar5;
      ref_used_flag = (RK_U32)bVar5;
    }
    for (discard = 0; discard < 7; discard = discard + 1) {
      if ((-1 < *(int *)((long)mframe + (ulong)discard * 4 + 0x38)) &&
         (mpp_buf_slot_get_prop
                    (ctx->task,*(RK_S32 *)((long)mframe + (ulong)discard * 4 + 0x38),SLOT_FRAME_PTR,
                     &error), _error != (MppFrame)0x0)) {
        uVar1 = local_68 >> ((byte)discard & 0x1f) & 1;
        if ((avs2d_parse_debug & 0x8000) != 0) {
          RVar2 = mpp_frame_get_poc(_error);
          RVar3 = mpp_frame_get_errinfo(_error);
          RVar4 = mpp_frame_get_discard(_error);
          _mpp_log_l(4,"avs2d_api","[CALLBACK]: ref_frm poc %d, err %d, dis %d, ref_used %d\n",
                     (char *)0x0,(ulong)RVar2,(ulong)RVar3,RVar4,uVar1);
        }
        if (uVar1 != 0) {
          RVar2 = mpp_frame_get_discard(_error);
          ref_used_flag = RVar2 | ref_used_flag;
          RVar2 = mpp_frame_get_errinfo(_error);
          ref_used = RVar2 | ref_used;
        }
      }
    }
    mpp_frame_set_errinfo(ref_frm,ref_used);
    mpp_frame_set_discard(ref_frm,ref_used_flag);
    if ((avs2d_parse_debug & 0x8000) != 0) {
      RVar2 = mpp_frame_get_poc(ref_frm);
      _mpp_log_l(4,"avs2d_api",
                 "[CALLBACK]: frame poc %d, ref=%d, dpberr=%d, harderr=%d, err:dis=%d:%d\n",
                 (char *)0x0,(ulong)RVar2,(ulong)((uint)(*(ulong *)((long)mframe + 8) >> 4) & 1),
                 (uint)(*(ulong *)((long)mframe + 8) >> 3) & 1,(task_dec->syntax).number,ref_used,
                 ref_used_flag);
    }
  }
  if ((avs2d_parse_debug & 8) != 0) {
    _mpp_log_l(4,"avs2d_api","Out.","avs2d_callback");
  }
  return p_dec._4_4_;
}

Assistant:

MPP_RET avs2d_callback(void *decoder, void *info)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Avs2dCtx_t *p_dec = (Avs2dCtx_t *)decoder;
    DecCbHalDone *ctx = (DecCbHalDone *)info;
    HalDecTask *task_dec = (HalDecTask *)ctx->task;
    MppFrame mframe = NULL;
    MppFrame ref_frm = NULL;
    RK_U32 i = 0;
    RK_U32 error = 0;
    RK_U32 discard = 0;
    RK_U32 ref_used = task_dec->flags.ref_info_valid ? task_dec->flags.ref_used : 0xff;
    RK_U32 ref_used_flag = 0;

    AVS2D_PARSE_TRACE("In.");
    mpp_buf_slot_get_prop(p_dec->frame_slots, task_dec->output, SLOT_FRAME_PTR, &mframe);

    if (!mframe) {
        ret = MPP_ERR_UNKNOW;
        AVS2D_DBG(AVS2D_DBG_CALLBACK, "[CALLBACK]: failed to get frame\n");
        goto __FAILED;
    }

    if (ctx->hard_err || task_dec->flags.ref_err) {
        if (task_dec->flags.used_for_ref) {
            error = 1;
        } else {
            discard = 1;
        }
    } else {
        if (task_dec->flags.ref_miss & ref_used) {
            discard = 1;
            AVS2D_DBG(AVS2D_DBG_CALLBACK, "[CALLBACK]: fake ref used, miss 0x%x used 0x%x\n",
                      task_dec->flags.ref_miss, ref_used);
        }
    }

    for (i = 0; i < AVS2_MAX_REFS; i++) {
        if (task_dec->refer[i] < 0)
            continue;

        mpp_buf_slot_get_prop(p_dec->frame_slots, task_dec->refer[i], SLOT_FRAME_PTR, &ref_frm);
        if (!ref_frm)
            continue;

        ref_used_flag = (ref_used >> i) & 1;
        //TODO: In fast mode, ref list isn't kept sync with task flag.ref_used
        AVS2D_DBG(AVS2D_DBG_CALLBACK, "[CALLBACK]: ref_frm poc %d, err %d, dis %d, ref_used %d\n",
                  mpp_frame_get_poc(ref_frm), mpp_frame_get_errinfo(ref_frm),
                  mpp_frame_get_discard(ref_frm), ref_used_flag);

        if (ref_used_flag) {
            discard |= mpp_frame_get_discard(ref_frm);
            error |= mpp_frame_get_errinfo(ref_frm);
        }
    }

    mpp_frame_set_errinfo(mframe, error);
    mpp_frame_set_discard(mframe, discard);

    AVS2D_DBG(AVS2D_DBG_CALLBACK, "[CALLBACK]: frame poc %d, ref=%d, dpberr=%d, harderr=%d, err:dis=%d:%d\n",
              mpp_frame_get_poc(mframe), task_dec->flags.used_for_ref, task_dec->flags.ref_err,
              ctx->hard_err, error, discard);

__FAILED:
    AVS2D_PARSE_TRACE("Out.");
    return ret;
}